

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Native::ToString
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  size_type sVar1;
  reference this;
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> local_78;
  string local_68;
  string local_38;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *local_18;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  local_18 = Args;
  Args_local = (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)__return_storage_ptr__;
  sVar1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(Args);
  if (sVar1 == 1) {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(local_18);
    std::shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_>::shared_ptr
              (&local_78,(nullptr_t)0x0);
    BasicValue::toString_abi_cxx11_(&local_68,this,&local_78);
    BasicValue::BasicValue(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_>::~shared_ptr
              (&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_38);
    BasicValue::BasicValue(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::ToString(std::list<BasicValue> &Args) {
  if (Args.size() != 1)
    return std::string();
  return Args.front().toString();
}